

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::AddUnexpectedCommand(cmState *this,string *name,char *error)

{
  anon_class_40_2_1ff6e45e local_68;
  Command local_40;
  char *local_20;
  char *error_local;
  string *name_local;
  cmState *this_local;
  
  local_20 = error;
  error_local = (char *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  local_68.error = local_20;
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<cmState::AddUnexpectedCommand(std::__cxx11::string_const&,char_const*)::__0,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_40,&local_68);
  AddBuiltinCommand(this,name,&local_40);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_40);
  AddUnexpectedCommand(std::__cxx11::string_const&,char_const*)::$_0::~__0((__0 *)&local_68);
  return;
}

Assistant:

void cmState::AddUnexpectedCommand(std::string const& name, const char* error)
{
  this->AddBuiltinCommand(
    name,
    [name, error](std::vector<cmListFileArgument> const&,
                  cmExecutionStatus& status) -> bool {
      cmValue versionValue =
        status.GetMakefile().GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
      if (name == "endif" &&
          (!versionValue || atof(versionValue->c_str()) <= 1.4)) {
        return true;
      }
      status.SetError(error);
      return false;
    });
}